

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btree.h
# Opt level: O2

iterator __thiscall
phmap::priv::
btree<phmap::priv::map_params<long,_long,_phmap::Less<long>,_std::allocator<std::pair<const_long,_long>_>,_256,_false>_>
::rebalance_after_delete
          (btree<phmap::priv::map_params<long,_long,_phmap::Less<long>,_std::allocator<std::pair<const_long,_long>_>,_256,_false>_>
           *this,iterator iter)

{
  byte bVar1;
  bool bVar2;
  btree_node<phmap::priv::map_params<long,_long,_phmap::Less<long>,_std::allocator<std::pair<const_long,_long>_>,_256,_false>_>
  *this_00;
  uint uVar3;
  bool bVar4;
  iterator iVar5;
  iterator res;
  btree_iterator<phmap::priv::btree_node<phmap::priv::map_params<long,_long,_phmap::Less<long>,_std::allocator<std::pair<const_long,_long>_>,_256,_false>_>,_std::pair<const_long,_long>_&,_std::pair<const_long,_long>_*>
  local_38;
  iterator local_28;
  
  local_28.node = iter.node;
  local_38.position = iter.position;
  bVar4 = true;
  local_38.node = local_28.node;
  local_28.position = local_38.position;
  while (local_28.node !=
         (this->root_).
         super__Tuple_impl<0UL,_phmap::Less<long>,_std::allocator<std::pair<const_long,_long>_>,_phmap::priv::btree_node<phmap::priv::map_params<long,_long,_phmap::Less<long>,_std::allocator<std::pair<const_long,_long>_>,_256,_false>_>_*>
         .
         super__Tuple_impl<1UL,_std::allocator<std::pair<const_long,_long>_>,_phmap::priv::btree_node<phmap::priv::map_params<long,_long,_phmap::Less<long>,_std::allocator<std::pair<const_long,_long>_>,_256,_false>_>_*>
         .
         super__Tuple_impl<2UL,_phmap::priv::btree_node<phmap::priv::map_params<long,_long,_phmap::Less<long>,_std::allocator<std::pair<const_long,_long>_>,_256,_false>_>_*>
         .
         super__Head_base<2UL,_phmap::priv::btree_node<phmap::priv::map_params<long,_long,_phmap::Less<long>,_std::allocator<std::pair<const_long,_long>_>,_256,_false>_>_*,_false>
         ._M_head_impl) {
    bVar1 = btree_node<phmap::priv::map_params<long,_long,_phmap::Less<long>,_std::allocator<std::pair<const_long,_long>_>,_256,_false>_>
            ::count(local_28.node);
    if (6 < bVar1) goto LAB_002062e2;
    bVar2 = try_merge_or_rebalance(this,&local_28);
    if (bVar4) {
      local_38.position = local_28.position;
      local_38.node = local_28.node;
    }
    if (!bVar2) goto LAB_002062e2;
    bVar1 = btree_node<phmap::priv::map_params<long,_long,_phmap::Less<long>,_std::allocator<std::pair<const_long,_long>_>,_256,_false>_>
            ::position(local_28.node);
    local_28.position = (int)bVar1;
    local_28.node =
         btree_node<phmap::priv::map_params<long,_long,_phmap::Less<long>,_std::allocator<std::pair<const_long,_long>_>,_256,_false>_>
         ::parent(local_28.node);
    bVar4 = false;
  }
  try_shrink(this);
  if (this->size_ == 0) {
    iVar5 = end(this);
    this_00 = iVar5.node;
    uVar3 = iVar5.position;
  }
  else {
LAB_002062e2:
    uVar3 = local_38.position;
    this_00 = local_38.node;
    bVar1 = btree_node<phmap::priv::map_params<long,_long,_phmap::Less<long>,_std::allocator<std::pair<const_long,_long>_>,_256,_false>_>
            ::count(local_38.node);
    if (uVar3 == bVar1) {
      bVar1 = btree_node<phmap::priv::map_params<long,_long,_phmap::Less<long>,_std::allocator<std::pair<const_long,_long>_>,_256,_false>_>
              ::count(this_00);
      local_38.position = bVar1 - 1;
      btree_iterator<phmap::priv::btree_node<phmap::priv::map_params<long,_long,_phmap::Less<long>,_std::allocator<std::pair<const_long,_long>_>,_256,_false>_>,_std::pair<const_long,_long>_&,_std::pair<const_long,_long>_*>
      ::increment(&local_38);
      this_00 = local_38.node;
      uVar3 = local_38.position;
    }
  }
  iVar5.position = uVar3;
  iVar5.node = this_00;
  iVar5._12_4_ = 0;
  return iVar5;
}

Assistant:

auto btree<P>::rebalance_after_delete(iterator iter) -> iterator {
        // Merge/rebalance as we walk back up the tree.
        iterator res(iter);
        bool first_iteration = true;
        for (;;) {
            if (iter.node == root()) {
                try_shrink();
                if (empty()) {
                    return end();
                }
                break;
            }
            if (iter.node->count() >= kMinNodeValues) {
                break;
            }
            bool merged = try_merge_or_rebalance(&iter);
            // On the first iteration, we should update `res` with `iter` because `res`
            // may have been invalidated.
            if (first_iteration) {
                res = iter;
                first_iteration = false;
            }
            if (!merged) {
                break;
            }
            iter.position = iter.node->position();
            iter.node = iter.node->parent();
        }

        // Adjust our return value. If we're pointing at the end of a node, advance
        // the iterator.
        if (res.position == res.node->count()) {
            res.position = res.node->count() - 1;
            ++res;
        }

        return res;
    }